

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O0

PHashSHA2_512 * pp_crypto_hash_sha2_512_new_internal(pboolean is384)

{
  PHashSHA2_512 *ret;
  PHashSHA2_512 *pPStack_10;
  pboolean is384_local;
  
  pPStack_10 = (PHashSHA2_512 *)p_malloc0(0xd8);
  if (pPStack_10 == (PHashSHA2_512 *)0x0) {
    pPStack_10 = (PHashSHA2_512 *)0x0;
  }
  else {
    pPStack_10->is384 = is384;
    p_crypto_hash_sha2_512_reset(pPStack_10);
  }
  return pPStack_10;
}

Assistant:

static PHashSHA2_512 *
pp_crypto_hash_sha2_512_new_internal (pboolean is384)
{
	PHashSHA2_512 *ret;

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PHashSHA2_512))) == NULL))
		return NULL;

	ret->is384 = is384;

	p_crypto_hash_sha2_512_reset (ret);

	return ret;
}